

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::
daily_file_sink(daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this,
               filename_t *base_filename,int rotation_hour,int rotation_minute,bool truncate,
               uint16_t max_files)

{
  int in_ECX;
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  time_point tVar1;
  undefined4 in_R8D;
  undefined2 in_R9W;
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *in_stack_00000010;
  filename_t filename;
  time_point now;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffef0;
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *in_stack_fffffffffffffef8;
  allocator *paVar2;
  undefined4 in_stack_ffffffffffffff10;
  daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *in_stack_ffffffffffffff48;
  string local_80 [32];
  undefined8 local_60;
  allocator local_51;
  string local_50 [8];
  tm *in_stack_ffffffffffffffb8;
  filename_t *in_stack_ffffffffffffffc0;
  
  base_sink<std::mutex>::base_sink
            ((base_sink<std::mutex> *)CONCAT44(in_R8D,in_stack_ffffffffffffff10));
  *(undefined ***)in_RDI = &PTR__daily_file_sink_00214680;
  std::__cxx11::string::string((string *)(in_RDI + 0x40),in_RSI);
  *(int *)(in_RDI + 0x60) = in_EDX;
  *(int *)(in_RDI + 100) = in_ECX;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffef0);
  tVar1.__d.__r = (duration)(in_RDI + 0x70);
  details::file_helper::file_helper((file_helper *)0x144883);
  in_RDI[0xa0] = (string)((byte)in_R8D & 1);
  *(undefined2 *)(in_RDI + 0xa2) = in_R9W;
  memset(in_RDI + 0xa8,0,0x38);
  details::
  circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  circular_q((circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1448c8);
  if ((((-1 < in_EDX) && (in_EDX < 0x18)) && (-1 < in_ECX)) && (in_ECX < 0x3c)) {
    local_60 = std::chrono::_V2::system_clock::now();
    now_tm(in_stack_fffffffffffffef8,tVar1);
    daily_filename_calculator::calc_filename(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    details::file_helper::open
              ((file_helper *)(in_RDI + 0x70),(char *)local_80,(byte)in_RDI[0xa0] & 1);
    tVar1 = next_rotation_tp_(in_stack_ffffffffffffff48);
    *(duration *)(in_RDI + 0x68) = tVar1.__d.__r;
    if (*(short *)(in_RDI + 0xa2) != 0) {
      init_filenames_q_(in_stack_00000010);
    }
    std::__cxx11::string::~string(local_80);
    return;
  }
  paVar2 = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"daily_file_sink: Invalid rotation time in ctor",paVar2);
  throw_spdlog_ex(in_RDI);
}

Assistant:

daily_file_sink(filename_t base_filename, int rotation_hour, int rotation_minute, bool truncate = false, uint16_t max_files = 0)
        : base_filename_(std::move(base_filename))
        , rotation_h_(rotation_hour)
        , rotation_m_(rotation_minute)
        , truncate_(truncate)
        , max_files_(max_files)
        , filenames_q_()
    {
        if (rotation_hour < 0 || rotation_hour > 23 || rotation_minute < 0 || rotation_minute > 59)
        {
            throw_spdlog_ex("daily_file_sink: Invalid rotation time in ctor");
        }

        auto now = log_clock::now();
        auto filename = FileNameCalc::calc_filename(base_filename_, now_tm(now));
        file_helper_.open(filename, truncate_);
        rotation_tp_ = next_rotation_tp_();

        if (max_files_ > 0)
        {
            init_filenames_q_();
        }
    }